

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void proxy_http_process_queue(ProxyNegotiator *pn)

{
  ptrlen *ppVar1;
  ProxyNegotiatorVT *pPVar2;
  bufchain *pbVar3;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var4;
  HttpAuthDetails *d;
  BinarySink *pBVar5;
  BinarySink *pBVar6;
  ptrlen pl;
  ptrlen password;
  SeatPromptResult spr_00;
  ptrlen method;
  ptrlen qop;
  ptrlen opaque;
  ptrlen pVar7;
  ptrlen pVar8;
  _Bool _Var9;
  int iVar10;
  HttpAuthType HVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  strbuf *psVar15;
  uintmax_t uVar16;
  HttpAuthDetails *pHVar17;
  prompts_t *ppVar18;
  InteractionReadySeat IVar19;
  BinarySink *pBVar20;
  BinarySink *pBVar21;
  InteractorVtable *pIVar22;
  char cVar23;
  long lVar24;
  ulong uVar25;
  BinarySink *pBVar26;
  ulong uVar27;
  uint32_t nonce_count;
  char cVar28;
  BinarySink *pBVar29;
  ulong uVar30;
  ptrlen pl_00;
  ptrlen pl_01;
  ptrlen pVar31;
  ptrlen pl_02;
  ptrlen pl_03;
  ptrlen pVar32;
  char c;
  char buf [2];
  int min_ver;
  BinarySink *local_2c0;
  void *local_2b8;
  size_t sStack_2b0;
  char *local_2a8;
  undefined8 uStack_2a0;
  char *local_298;
  undefined8 uStack_290;
  void *local_288;
  undefined8 uStack_280;
  void *local_278;
  undefined8 uStack_270;
  void *local_268;
  undefined8 uStack_260;
  SeatPromptResult spr;
  char dest [512];
  
  pBVar29 = pn[-2].output[0].binarysink_;
  iVar12 = *(int *)&pn[-2].output[0].binarysink_[0].write;
  if (iVar12 == 0x2e6) {
LAB_001415b7:
    IVar19 = interactor_announce(pn->itr);
    (*(IVar19.seat)->vt->get_userpass_input)
              (&spr,IVar19.seat,(prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_);
    if (spr.kind == SPRK_OK) {
      if (*(int *)&pn[-1].itr != -1) {
        strbuf_clear(*(strbuf **)&pn[-2].aborted);
        lVar24 = *(long *)&pn[-2].aborted;
        pcVar14 = prompt_get_result_ref
                            (*(prompt_t **)
                              (pn[-1].output[0].binarysink_[0].binarysink_[2].writefmtv +
                              (long)*(int *)&pn[-1].itr * 8));
        pVar32 = ptrlen_from_asciz(pcVar14);
        BinarySink_put_datapl((BinarySink *)(lVar24 + 0x18),pVar32);
      }
      strbuf_clear((strbuf *)pn[-1].vt);
      pPVar2 = pn[-1].vt;
      pcVar14 = prompt_get_result_ref
                          (*(prompt_t **)
                            (pn[-1].output[0].binarysink_[0].binarysink_[2].writefmtv +
                            (long)*(int *)((long)&pn[-1].itr + 4) * 8));
      pVar32 = ptrlen_from_asciz(pcVar14);
      BinarySink_put_datapl((BinarySink *)&pPVar2->type,pVar32);
      free_prompts((prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_);
      pn[-1].output[0].binarysink_[0].binarysink_ = (BinarySink *)0x0;
LAB_00140a7a:
      pBVar5 = pn->output[0].binarysink_;
      BinarySink_put_fmt(pBVar5,"CONNECT %s HTTP/1.1\r\nHost: %s\r\n",
                         *(undefined8 *)pn[-1].output[0].binarysink_[0].write);
      iVar12 = *(int *)&(pn[-1].input)->head;
      if (iVar12 == 3) {
        pVar31.len = 0x1c;
        pVar31.ptr = "Proxy-Authorization: Digest ";
        BinarySink_put_datapl(pBVar5,pVar31);
        pVar8.ptr = (pn[-2].itr)->parent;
        pVar8.len = (size_t)(pn[-2].itr)->last_to_talk;
        _Var9 = ptrlen_eq_ptrlen(pVar8,*(ptrlen *)((pn[-1].input)->queue_idempotent_callback + 8));
        if (!_Var9) {
          *(undefined4 *)&pn[-1].output[0].binarysink_[0].writefmtv = 0;
        }
        pVar32 = *(ptrlen *)(*(long *)&pn[-2].aborted + 8);
        password.ptr = (pn[-1].vt)->process_queue;
        password.len = (size_t)(pn[-1].vt)->free;
        pbVar3 = pn[-1].input;
        ppVar1 = (ptrlen *)(pbVar3->buffersize + 8);
        local_268 = ppVar1->ptr;
        uStack_260 = *(undefined8 *)(pbVar3->buffersize + 0x10);
        pVar7 = *ppVar1;
        local_298 = "CONNECT";
        uStack_290 = 7;
        p_Var4 = pn[-1].output[0].binarysink_[0].write;
        ppVar1 = (ptrlen *)(p_Var4 + 8);
        local_278 = ppVar1->ptr;
        uStack_270 = *(undefined8 *)(p_Var4 + 0x10);
        pVar8 = *ppVar1;
        local_2a8 = "auth";
        uStack_2a0 = 4;
        ppVar1 = (ptrlen *)(pbVar3->queue_idempotent_callback + 8);
        local_288 = ppVar1->ptr;
        uStack_280 = *(undefined8 *)(pbVar3->queue_idempotent_callback + 0x10);
        pVar31 = *ppVar1;
        local_2b8 = (void *)0x0;
        sStack_2b0 = 0;
        if (*(char *)&pbVar3[1].tail == '\x01') {
          local_2b8 = pbVar3->ic->ctx;
          sStack_2b0 = *(size_t *)&pbVar3->ic->queued;
        }
        nonce_count = *(int *)&pn[-1].output[0].binarysink_[0].writefmtv + 1;
        *(uint32_t *)&pn[-1].output[0].binarysink_[0].writefmtv = nonce_count;
        method.len = 7;
        method.ptr = "CONNECT";
        qop.len = 4;
        qop.ptr = "auth";
        opaque.len = sStack_2b0;
        opaque.ptr = local_2b8;
        http_digest_response
                  (pBVar5,pVar32,password,pVar7,method,pVar8,qop,pVar31,opaque,nonce_count,
                   *(HttpDigestHash *)&pbVar3->tail,*(_Bool *)((long)&pbVar3[1].tail + 1));
        pl_02.len = 2;
        pl_02.ptr = "\r\n";
        BinarySink_put_datapl(pBVar5,pl_02);
      }
      else if (iVar12 == 2) {
        pl_00.len = 0x1b;
        pl_00.ptr = "Proxy-Authorization: Basic ";
        local_2c0 = pBVar29;
        BinarySink_put_datapl(pBVar5,pl_00);
        psVar15 = strbuf_new_nm();
        pBVar29 = psVar15->binarysink_;
        BinarySink_put_datapl(pBVar29,*(ptrlen *)(*(long *)&pn[-2].aborted + 8));
        BinarySink_put_byte(pBVar29,':');
        pl.ptr = (pn[-1].vt)->process_queue;
        pl.len = (size_t)(pn[-1].vt)->free;
        BinarySink_put_datapl(pBVar29,pl);
        uVar27 = psVar15->len;
        uVar25 = uVar27;
        for (uVar30 = 0; uVar30 < uVar27; uVar30 = uVar30 + 3) {
          iVar12 = 3;
          if (uVar25 < 3) {
            iVar12 = (int)uVar25;
          }
          base64_encode_atom(psVar15->u + uVar30,iVar12,dest);
          BinarySink_put_data(pBVar5,dest,4);
          uVar25 = uVar25 - 3;
        }
        strbuf_free(psVar15);
        smemclr(dest,4);
        pl_01.len = 2;
        pl_01.ptr = "\r\n";
        BinarySink_put_datapl(pBVar5,pl_01);
        pBVar29 = local_2c0;
      }
      pl_03.len = 2;
      pl_03.ptr = "\r\n";
      BinarySink_put_datapl(pBVar5,pl_03);
      *(undefined4 *)&pBVar29->write = 0x1cf;
      return;
    }
    if (1 < spr.kind - SPRK_USER_ABORT) {
      *(undefined4 *)&pBVar29->write = 0x2e6;
      return;
    }
    spr_00._4_4_ = spr._4_4_;
    spr_00.kind = spr.kind;
    spr_00.errfn = spr.errfn;
    spr_00.errdata_lit = spr.errdata_lit;
    spr_00.errdata_u = spr.errdata_u;
    spr_00._28_4_ = spr._28_4_;
    proxy_spr_abort(pn,spr_00);
    goto LAB_00141386;
  }
  if (iVar12 == 0x1cf) {
    *(undefined8 *)&pn[-1].done = 0;
    pn[-1].aborted = false;
    *(undefined1 *)((long)&pn[-1].ps + 4) = 0;
    strbuf_clear((strbuf *)pn[-2].output[0].binarysink_[0].writefmtv);
    *(undefined4 *)&pn[-2].output[0].binarysink_[0].write = 0x1da;
LAB_001409c9:
    _Var9 = read_line(pn->input,(strbuf *)pn[-2].output[0].binarysink_[0].writefmtv,false);
    if (!_Var9) {
      return;
    }
    iVar12 = __isoc99_sscanf(*(undefined8 *)pn[-2].output[0].binarysink_[0].writefmtv,
                             "HTTP/%d.%d %n%d",dest,&min_ver,&pn[-2].done,&pn[-1].ps);
    if (2 < iVar12) {
      if (((int)dest._0_4_ < 1) || ((dest._0_4_ == 1 && (min_ver < 1)))) {
        *(undefined1 *)((long)&pn[-1].ps + 4) = 1;
      }
      if (*(int *)&pn[-1].ps == 0x197) {
        http_auth_details_free((HttpAuthDetails *)pn[-1].input);
        pHVar17 = http_auth_details_new();
        pn[-1].input = (bufchain *)pHVar17;
        auth_error(pHVar17,
                   "no Proxy-Authorization header seen in HTTP 407 Proxy Authentication Required response"
                  );
      }
      psVar15 = (strbuf *)pn[-2].output[0].binarysink_[0].binarysink_;
      goto LAB_00140d14;
    }
    pcVar14 = "HTTP response was absent or malformed";
LAB_00140a70:
    pcVar14 = dupstr(pcVar14);
  }
  else {
    if (iVar12 == 0x1da) goto LAB_001409c9;
    if (iVar12 == 0x1ff) {
      do {
        _Var9 = read_line(pn->input,(strbuf *)pn[-2].output[0].binarysink_[0].binarysink_,true);
        if (!_Var9) {
          return;
        }
        pn[-2].error = (char *)0x0;
        _Var9 = get_token((HttpProxyNegotiator *)pBVar29);
        if (_Var9) {
          pIVar22 = (pn[-2].itr)->vt;
          iVar12 = strcasecmp((char *)pIVar22,"Connection");
          cVar28 = (iVar12 != 0) * '\x05';
          iVar12 = strcasecmp((char *)pIVar22,"Content-Length");
          if (iVar12 == 0) {
            cVar28 = '\x01';
          }
          iVar12 = strcasecmp((char *)pIVar22,"Transfer-Encoding");
          if (iVar12 == 0) {
            cVar28 = '\x02';
          }
          iVar12 = strcasecmp((char *)pIVar22,"Proxy-Authenticate");
          if (iVar12 == 0) {
            cVar28 = '\x03';
          }
          iVar10 = strcasecmp((char *)pIVar22,"Proxy-Connection");
          cVar23 = '\x04';
          if (iVar10 != 0) {
            cVar23 = cVar28;
          }
          _Var9 = get_separator((HttpProxyNegotiator *)pBVar29,':');
          if (_Var9) {
            if (cVar23 == '\x01') {
              _Var9 = get_token((HttpProxyNegotiator *)pBVar29);
              if (_Var9) {
                uVar16 = strtoumax((char *)(pn[-2].itr)->vt,(char **)0x0,10);
                *(uintmax_t *)&pn[-1].done = uVar16;
              }
            }
            else if (cVar23 == '\x02') {
              while (_Var9 = get_token((HttpProxyNegotiator *)pBVar29), _Var9) {
                iVar12 = strcasecmp((char *)(pn[-2].itr)->vt,"chunked");
                if (iVar12 == 0) {
                  pn[-1].aborted = true;
                }
              }
            }
            else if ((iVar10 == 0) || (cVar23 == '\0')) {
              _Var9 = get_token((HttpProxyNegotiator *)pBVar29);
              if (_Var9) {
                pIVar22 = (pn[-2].itr)->vt;
                iVar12 = strcasecmp((char *)pIVar22,"close");
                if (iVar12 == 0) {
                  *(undefined1 *)((long)&pn[-1].ps + 4) = 1;
                }
                else {
                  iVar12 = strcasecmp((char *)pIVar22,"keep-alive");
                  if (iVar12 == 0) {
                    *(undefined1 *)((long)&pn[-1].ps + 4) = 0;
                  }
                }
              }
            }
            else if (iVar12 == 0) {
              pHVar17 = http_auth_details_new();
              pHVar17->digest_hash = HTTP_DIGEST_MD5;
              _Var9 = get_token((HttpProxyNegotiator *)pBVar29);
              if (_Var9) {
                pIVar22 = (pn[-2].itr)->vt;
                iVar12 = strcasecmp((char *)pIVar22,"Basic");
                if (iVar12 != 0) {
                  iVar12 = strcasecmp((char *)pIVar22,"Digest");
                  if (iVar12 == 0) {
                    while (_Var9 = get_token((HttpProxyNegotiator *)pBVar29), _Var9) {
                      pIVar22 = (pn[-2].itr)->vt;
                      iVar12 = strcasecmp((char *)pIVar22,"realm");
                      if (iVar12 == 0) {
                        _Var9 = get_separator((HttpProxyNegotiator *)pBVar29,'=');
                        if ((!_Var9) ||
                           (_Var9 = get_quoted_string((HttpProxyNegotiator *)pBVar29), !_Var9)) {
                          pcVar14 = "parse error in Digest realm field";
                          goto LAB_00140f17;
                        }
                        psVar15 = pHVar17->realm;
LAB_001410f0:
                        pVar32.ptr = (pn[-2].itr)->parent;
                        pVar32.len = (size_t)(pn[-2].itr)->last_to_talk;
                        BinarySink_put_datapl(psVar15->binarysink_,pVar32);
                      }
                      else {
                        iVar12 = strcasecmp((char *)pIVar22,"nonce");
                        if (iVar12 == 0) {
                          _Var9 = get_separator((HttpProxyNegotiator *)pBVar29,'=');
                          if ((_Var9) &&
                             (_Var9 = get_quoted_string((HttpProxyNegotiator *)pBVar29), _Var9)) {
                            psVar15 = pHVar17->nonce;
                            goto LAB_001410f0;
                          }
                          pcVar14 = "parse error in Digest nonce field";
                          goto LAB_00140f17;
                        }
                        iVar12 = strcasecmp((char *)pIVar22,"opaque");
                        if (iVar12 == 0) {
                          _Var9 = get_separator((HttpProxyNegotiator *)pBVar29,'=');
                          if ((!_Var9) ||
                             (_Var9 = get_quoted_string((HttpProxyNegotiator *)pBVar29), !_Var9)) {
                            pcVar14 = "parse error in Digest opaque field";
                            goto LAB_00140f17;
                          }
                          pVar7.ptr = (pn[-2].itr)->parent;
                          pVar7.len = (size_t)(pn[-2].itr)->last_to_talk;
                          BinarySink_put_datapl(pHVar17->opaque->binarysink_,pVar7);
                          pHVar17->got_opaque = true;
                        }
                        else {
                          iVar12 = strcasecmp((char *)pIVar22,"stale");
                          if (iVar12 == 0) {
                            _Var9 = get_separator((HttpProxyNegotiator *)pBVar29,'=');
                            if ((!_Var9) ||
                               (_Var9 = get_token((HttpProxyNegotiator *)pBVar29), !_Var9)) {
                              pcVar14 = "parse error in Digest stale field";
                              goto LAB_00140f17;
                            }
                            iVar12 = strcasecmp((char *)(pn[-2].itr)->vt,"true");
                            pHVar17->digest_nonce_was_stale = iVar12 == 0;
                          }
                          else {
                            iVar12 = strcasecmp((char *)pIVar22,"userhash");
                            if (iVar12 == 0) {
                              _Var9 = get_separator((HttpProxyNegotiator *)pBVar29,'=');
                              if ((!_Var9) ||
                                 (_Var9 = get_token((HttpProxyNegotiator *)pBVar29), !_Var9)) {
                                pcVar14 = "parse error in Digest userhash field";
                                goto LAB_00140f17;
                              }
                              iVar12 = strcasecmp((char *)(pn[-2].itr)->vt,"true");
                              pHVar17->hash_username = iVar12 == 0;
                            }
                            else {
                              iVar12 = strcasecmp((char *)pIVar22,"algorithm");
                              if (iVar12 == 0) {
                                _Var9 = get_separator((HttpProxyNegotiator *)pBVar29,'=');
                                if ((!_Var9) ||
                                   ((_Var9 = get_token((HttpProxyNegotiator *)pBVar29), !_Var9 &&
                                    (_Var9 = get_quoted_string((HttpProxyNegotiator *)pBVar29),
                                    !_Var9)))) {
                                  pcVar14 = "parse error in Digest algorithm field";
                                  goto LAB_00140f17;
                                }
                                pIVar22 = (pn[-2].itr)->vt;
                                lVar24 = 0;
                                while( true ) {
                                  if (lVar24 == 3) {
                                    pcVar14 = "Digest hash algorithm \'%s\' not recognised";
                                    goto LAB_00140ec0;
                                  }
                                  iVar12 = strcasecmp((char *)pIVar22,httphashnames[lVar24]);
                                  if (iVar12 == 0) break;
                                  lVar24 = lVar24 + 1;
                                }
                                if (httphashaccepted[lVar24] == false) {
                                  pcVar14 = "Digest hash algorithm \'%s\' not supported";
                                  goto LAB_00140ec0;
                                }
                                pHVar17->digest_hash = (HttpDigestHash)lVar24;
                              }
                              else {
                                iVar12 = strcasecmp((char *)pIVar22,"qop");
                                _Var9 = get_separator((HttpProxyNegotiator *)pBVar29,'=');
                                if (iVar12 == 0) {
                                  if ((!_Var9) ||
                                     (_Var9 = get_quoted_string((HttpProxyNegotiator *)pBVar29),
                                     !_Var9)) {
                                    pcVar14 = "parse error in Digest qop field";
                                    goto LAB_00140f17;
                                  }
                                  pIVar22 = (pn[-2].itr)->vt;
                                  iVar12 = strcasecmp((char *)pIVar22,"auth");
                                  if (iVar12 != 0) {
                                    pcVar14 = "quality-of-protection type \'%s\' not supported";
                                    goto LAB_00140ec0;
                                  }
                                }
                                else if ((!_Var9) ||
                                        ((_Var9 = get_quoted_string((HttpProxyNegotiator *)pBVar29),
                                         !_Var9 && (_Var9 = get_token((HttpProxyNegotiator *)pBVar29
                                                                     ), !_Var9)))) break;
                              }
                            }
                          }
                        }
                      }
                      pBVar5 = pn[-2].output[0].binarysink_[0].binarysink_;
                      pBVar20 = (BinarySink *)pn[-2].error;
                      pBVar6 = pBVar5->binarysink_;
                      pBVar26 = pBVar6;
                      if (pBVar6 < pBVar20) {
                        pBVar26 = pBVar20;
                      }
                      while (((pBVar21 = pBVar26, pBVar20 < pBVar6 &&
                              (uVar27 = (ulong)*(byte *)((long)&pBVar20->write + (long)pBVar5->write
                                                        ), pBVar21 = pBVar20, uVar27 < 0x21)) &&
                             ((0x100000600U >> (uVar27 & 0x3f) & 1) != 0))) {
                        pBVar20 = (BinarySink *)((long)&pBVar20->write + 1);
                      }
                      if (pBVar21 == pBVar6) {
                        pn[-2].error = (char *)pBVar6;
                        pHVar17->auth_type = AUTH_DIGEST;
                        HVar11 = AUTH_DIGEST;
                        goto LAB_00140f24;
                      }
                      _Var9 = get_separator((HttpProxyNegotiator *)pBVar29,',');
                      if (!_Var9) break;
                    }
                    pcVar14 = "parse error in Digest header";
                    goto LAB_00140f17;
                  }
                  pcVar14 = "authentication type \'%s\' not supported";
LAB_00140ec0:
                  auth_error(pHVar17,pcVar14,pIVar22);
                  goto LAB_00140f21;
                }
                pHVar17->auth_type = AUTH_BASIC;
                HVar11 = AUTH_BASIC;
              }
              else {
                pcVar14 = "parse error";
LAB_00140f17:
                auth_error(pHVar17,pcVar14);
LAB_00140f21:
                HVar11 = pHVar17->auth_type;
              }
LAB_00140f24:
              d = (HttpAuthDetails *)pn[-1].input;
              if (HVar11 == d->auth_type) {
                if ((HVar11 == AUTH_DIGEST) && (pHVar17->digest_hash < d->digest_hash)) {
LAB_00140f47:
                  http_auth_details_free(pHVar17);
                  goto LAB_00140f4f;
                }
              }
              else if (HVar11 <= d->auth_type) goto LAB_00140f47;
              http_auth_details_free(d);
              pn[-1].input = (bufchain *)pHVar17;
            }
          }
        }
LAB_00140f4f:
        psVar15 = (strbuf *)pn[-2].output[0].binarysink_[0].binarysink_;
        if ((BinarySink *)psVar15->len == (BinarySink *)0x0) {
          if (pn[-1].aborted != false) goto LAB_00141393;
          *(undefined4 *)&pBVar29->write = 0x264;
          goto LAB_00140f71;
        }
LAB_00140d14:
        strbuf_clear(psVar15);
        *(undefined4 *)&pBVar29->write = 0x1ff;
      } while( true );
    }
    if (iVar12 == 0x264) {
LAB_00140f71:
      _Var9 = bufchain_try_consume(pn->input,*(size_t *)&pn[-1].done);
      if (!_Var9) {
        return;
      }
LAB_00141438:
      if (*(int *)&pn[-1].ps - 200U < 100) {
        pn->done = true;
LAB_0014144c:
        *(undefined4 *)&pBVar29->write = 0;
        return;
      }
      if (*(int *)&pn[-1].ps != 0x197) {
        pcVar14 = dupprintf("HTTP response %s",
                            (long)*(int *)&pn[-2].done +
                            *(long *)pn[-2].output[0].binarysink_[0].writefmtv);
        goto LAB_00141382;
      }
      if (*(char *)((long)&pn[-1].ps + 4) == '\x01') {
        pn->reconnect = true;
      }
      pbVar3 = pn[-1].input;
      if (*(int *)&pbVar3->head != 0) {
        if (*(char *)&pn[-1].output[0].ch == '\x01') {
          *(undefined1 *)&pn[-1].output[0].ch = 0;
          goto LAB_00140a7a;
        }
        if (*(char *)((long)&pbVar3->head + 4) != '\0') goto LAB_00140a7a;
        if (pn->itr != (Interactor *)0x0) {
          ppVar18 = proxy_new_prompts(pn->ps);
          pn[-1].output[0].binarysink_[0].binarysink_ = (BinarySink *)ppVar18;
          ppVar18->to_server = true;
          ppVar18->from_server = false;
          pcVar14 = dupstr("HTTP proxy authentication");
          ppVar18 = (prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_;
          ppVar18->name = pcVar14;
          if (*(long *)(*(long *)&pn[-2].aborted + 0x10) == 0) {
            *(int *)&pn[-1].itr = (int)ppVar18->n_prompts;
            pcVar14 = dupstr("Proxy username: ");
            add_prompt(ppVar18,pcVar14,true);
            ppVar18 = (prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_;
          }
          else {
            *(undefined4 *)&pn[-1].itr = 0xffffffff;
          }
          *(int *)((long)&pn[-1].itr + 4) = (int)ppVar18->n_prompts;
          pcVar14 = dupstr("Proxy password: ");
          add_prompt(ppVar18,pcVar14,false);
          goto LAB_001415b7;
        }
        pcVar14 = "HTTP proxy requested authentication which we do not have";
        goto LAB_001414cf;
      }
      pcVar14 = (char *)(pbVar3[1].head)->next;
      goto LAB_00140a70;
    }
    if (iVar12 == 0x271) goto LAB_001413a0;
    if (iVar12 == 0x289) goto LAB_001413f2;
    if (iVar12 != 0x28f) {
      if (iVar12 == 0) {
        lVar24 = *(long *)&pn[-2].aborted;
        pcVar14 = conf_get_str(pn->ps->conf,0x10);
        pVar32 = ptrlen_from_asciz(pcVar14);
        BinarySink_put_datapl((BinarySink *)(lVar24 + 0x18),pVar32);
        pPVar2 = pn[-1].vt;
        pcVar14 = conf_get_str(pn->ps->conf,0x11);
        pVar32 = ptrlen_from_asciz(pcVar14);
        BinarySink_put_datapl((BinarySink *)&pPVar2->type,pVar32);
        if ((*(long *)(*(long *)&pn[-2].aborted + 0x10) != 0) ||
           ((pn[-1].vt)->free != (_func_void_ProxyNegotiator_ptr *)0x0)) {
          *(undefined1 *)&pn[-1].output[0].ch = 1;
        }
        sk_getaddr(pn->ps->remote_addr,dest,0x200);
        BinarySink_put_fmt((BinarySink *)(pn[-1].output[0].binarysink_[0].write + 0x18),"%s:%d",dest
                           ,(ulong)(uint)pn->ps->remote_port);
        goto LAB_00140a7a;
      }
      goto LAB_0014144c;
    }
    while( true ) {
      _Var9 = bufchain_try_fetch_consume(pn->input,buf,2);
      if (!_Var9) {
        return;
      }
      if (buf != (char  [2])0xa0d) break;
      if (pn[-1].error == (char *)0x0) goto LAB_00141438;
LAB_00141393:
      pn[-1].error = (char *)0x0;
      while( true ) {
        *(undefined4 *)&pBVar29->write = 0x271;
LAB_001413a0:
        _Var9 = bufchain_try_fetch_consume(pn->input,&c,1);
        if (!_Var9) {
          return;
        }
        iVar12 = (int)c;
        if (iVar12 == 10) break;
        if (c != '\r') {
          if ((byte)(c - 0x30U) < 10) {
            pcVar14 = (char *)((ulong)(iVar12 - 0x30) | (long)pn[-1].error << 4);
          }
          else {
            if ((byte)(c + 0xbfU) < 6) {
              pcVar14 = pn[-1].error;
              uVar13 = iVar12 - 0x37;
            }
            else {
              if (5 < (byte)(c + 0x9fU)) {
                pcVar14 = dupprintf(
                                   "Received bad character 0x%02X in chunk length during HTTP chunked transfer encoding"
                                   );
                goto LAB_00141382;
              }
              pcVar14 = pn[-1].error;
              uVar13 = iVar12 - 0x57;
            }
            pcVar14 = (char *)((ulong)uVar13 + (long)pcVar14 * 0x10);
          }
          pn[-1].error = pcVar14;
        }
      }
      *(undefined4 *)&pBVar29->write = 0x289;
LAB_001413f2:
      _Var9 = bufchain_try_consume(pn->input,(size_t)pn[-1].error);
      if (!_Var9) {
        return;
      }
      *(undefined4 *)&pBVar29->write = 0x28f;
    }
    pcVar14 = "Missing CRLF after chunk during HTTP chunked transfer encoding";
LAB_001414cf:
    pcVar14 = dupprintf(pcVar14);
  }
LAB_00141382:
  pn->error = pcVar14;
LAB_00141386:
  *(undefined4 *)&pn[-2].output[0].binarysink_[0].write = 0;
  return;
}

Assistant:

static void proxy_http_process_queue(ProxyNegotiator *pn)
{
    HttpProxyNegotiator *s = container_of(pn, HttpProxyNegotiator, pn);

    crBegin(s->crLine);

    /*
     * Initialise our username and password strbufs from the Conf.
     */
    put_dataz(s->username, conf_get_str(pn->ps->conf, CONF_proxy_username));
    put_dataz(s->password, conf_get_str(pn->ps->conf, CONF_proxy_password));
    if (s->username->len || s->password->len)
        s->try_auth_from_conf = true;

    /*
     * Set up the host:port string we're trying to connect to, also
     * used as the URI string in HTTP Digest auth.
     */
    {
        char dest[512];
        sk_getaddr(pn->ps->remote_addr, dest, lenof(dest));
        put_fmt(s->uri, "%s:%d", dest, pn->ps->remote_port);
    }

    while (true) {
        /*
         * Standard prefix for the HTTP CONNECT request.
         */
        put_fmt(pn->output,
                "CONNECT %s HTTP/1.1\r\n"
                "Host: %s\r\n", s->uri->s, s->uri->s);

        /*
         * Add an auth header, if we're planning to this time round.
         */
        if (s->next_auth->auth_type == AUTH_BASIC) {
            put_datalit(pn->output, "Proxy-Authorization: Basic ");

            strbuf *base64_input = strbuf_new_nm();
            put_datapl(base64_input, ptrlen_from_strbuf(s->username));
            put_byte(base64_input, ':');
            put_datapl(base64_input, ptrlen_from_strbuf(s->password));

            char base64_output[4];
            for (size_t i = 0, e = base64_input->len; i < e; i += 3) {
                base64_encode_atom(base64_input->u + i,
                                   e-i > 3 ? 3 : e-i, base64_output);
                put_data(pn->output, base64_output, 4);
            }
            strbuf_free(base64_input);
            smemclr(base64_output, sizeof(base64_output));
            put_datalit(pn->output, "\r\n");
        } else if (s->next_auth->auth_type == AUTH_DIGEST) {
            put_datalit(pn->output, "Proxy-Authorization: Digest ");

            /* If we have a fresh nonce, reset the
             * nonce count. Otherwise, keep incrementing it. */
            if (!ptrlen_eq_ptrlen(ptrlen_from_strbuf(s->token),
                                  ptrlen_from_strbuf(s->next_auth->nonce)))
                s->nonce_count = 0;

            http_digest_response(BinarySink_UPCAST(pn->output),
                                 ptrlen_from_strbuf(s->username),
                                 ptrlen_from_strbuf(s->password),
                                 ptrlen_from_strbuf(s->next_auth->realm),
                                 PTRLEN_LITERAL("CONNECT"),
                                 ptrlen_from_strbuf(s->uri),
                                 PTRLEN_LITERAL("auth"),
                                 ptrlen_from_strbuf(s->next_auth->nonce),
                                 (s->next_auth->got_opaque ?
                                  ptrlen_from_strbuf(s->next_auth->opaque) :
                                  make_ptrlen(NULL, 0)),
                                 ++s->nonce_count, s->next_auth->digest_hash,
                                 s->next_auth->hash_username);
            put_datalit(pn->output, "\r\n");
        }

        /*
         * Blank line to terminate the HTTP request.
         */
        put_datalit(pn->output, "\r\n");
        crReturnV;

        s->content_length = 0;
        s->chunked_transfer = false;
        s->connection_close = false;

        /*
         * Read and parse the HTTP status line, and check if it's a 2xx
         * for success.
         */
        strbuf_clear(s->response);
        crMaybeWaitUntilV(read_line(pn->input, s->response, false));
        {
            int maj_ver, min_ver, n_scanned;
            n_scanned = sscanf(
                s->response->s, "HTTP/%d.%d %n%d",
                &maj_ver, &min_ver, &s->http_status_pos, &s->http_status);

            if (n_scanned < 3) {
                pn->error = dupstr("HTTP response was absent or malformed");
                crStopV;
            }

            if (maj_ver < 1 || (maj_ver == 1 && min_ver < 1)) {
                /* Before HTTP/1.1, connections close by default */
                s->connection_close = true;
            }
        }

        if (s->http_status == 407) {
            /*
             * If this is going to be an auth request, we expect to
             * see at least one Proxy-Authorization header offering us
             * auth options. Start by preloading s->next_auth with a
             * fallback error message, which will be used if nothing
             * better is available.
             */
            http_auth_details_free(s->next_auth);
            s->next_auth = http_auth_details_new();
            auth_error(s->next_auth, "no Proxy-Authorization header seen in "
                       "HTTP 407 Proxy Authentication Required response");
        }

        /*
         * Read the HTTP response header section.
         */
        do {
            strbuf_clear(s->header);
            crMaybeWaitUntilV(read_line(pn->input, s->header, true));
            s->header_pos = 0;

            if (!get_token(s)) {
                /* Possibly we ought to panic if we see an HTTP header
                 * we can't make any sense of at all? But whatever,
                 * ignore it and hope the next one makes more sense */
                continue;
            }

            /* Parse the header name */
            HttpHeader hdr = HDR_UNKNOWN;
            {
                #define CHECK_HEADER(id, string) \
                    if (!stricmp(s->token->s, string)) hdr = id;
                HTTP_HEADER_LIST(CHECK_HEADER);
                #undef CHECK_HEADER
            }

            if (!get_separator(s, ':'))
                continue;

            if (hdr == HDR_CONTENT_LENGTH) {
                if (!get_token(s))
                    continue;
                s->content_length = strtoumax(s->token->s, NULL, 10);
            } else if (hdr == HDR_TRANSFER_ENCODING) {
                /*
                 * The Transfer-Encoding header value should be a
                 * comma-separated list of keywords including
                 * "chunked", "deflate" and "gzip". We parse it in the
                 * most superficial way, by just looking for "chunked"
                 * and ignoring everything else.
                 *
                 * It's OK to do that because we're not actually
                 * _using_ the error document - we only have to skip
                 * over it to find the end of the HTTP response. So we
                 * don't care if it's gzipped or not.
                 */
                while (get_token(s)) {
                    if (!stricmp(s->token->s, "chunked"))
                        s->chunked_transfer = true;
                }
            } else if (hdr == HDR_CONNECTION ||
                       hdr == HDR_PROXY_CONNECTION) {
                if (!get_token(s))
                    continue;
                if (!stricmp(s->token->s, "close"))
                    s->connection_close = true;
                else if (!stricmp(s->token->s, "keep-alive"))
                    s->connection_close = false;
            } else if (hdr == HDR_PROXY_AUTHENTICATE) {
                HttpAuthDetails *auth = parse_http_auth_header(s);

                /*
                 * See if we prefer this set of auth details to the
                 * previous one we had (either from a previous auth
                 * header, or the fallback when no auth header is
                 * provided at all).
                 */
                bool change;

                if (auth->auth_type != s->next_auth->auth_type) {
                    /* Use the preference order implied by the enum */
                    change = auth->auth_type > s->next_auth->auth_type;
                } else if (auth->auth_type == AUTH_DIGEST &&
                           auth->digest_hash != s->next_auth->digest_hash) {
                    /* Choose based on the hash functions */
                    change = auth->digest_hash > s->next_auth->digest_hash;
                } else {
                    /*
                     * If in doubt, go with the later one of the
                     * headers.
                     *
                     * The main reason for this is so that an error in
                     * interpreting an auth header will supersede the
                     * default error we preload saying 'no header
                     * found', because that would be a particularly
                     * bad error to report if there _was_ one.
                     *
                     * But we're in a tie-breaking situation by now,
                     * so there's no other reason to choose - we might
                     * as well apply the same policy everywhere else
                     * too.
                     */
                    change = true;
                }

                if (change) {
                    http_auth_details_free(s->next_auth);
                    s->next_auth = auth;
                } else {
                    http_auth_details_free(auth);
                }
            }
        } while (s->header->len > 0);

        /* Read and ignore the entire response document */
        if (!s->chunked_transfer) {
            /* Simple approach: read exactly Content-Length bytes */
            crMaybeWaitUntilV(bufchain_try_consume(
                                  pn->input, s->content_length));
        } else {
            /* Chunked transfer: read a sequence of
             * <hex length>\r\n<data>\r\n chunks, terminating in one with
             * zero length */
            do {
                /*
                 * Expect a chunk length
                 */
                s->chunk_length = 0;
                while (true) {
                    char c;
                    crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                          pn->input, &c, 1));
                    if (c == '\r') {
                        continue;
                    } else if (c == '\n') {
                        break;
                    } else if ('0' <= c && c <= '9') {
                        s->chunk_length = s->chunk_length*16 + (c-'0');
                    } else if ('A' <= c && c <= 'F') {
                        s->chunk_length = s->chunk_length*16 + (c-'A'+10);
                    } else if ('a' <= c && c <= 'f') {
                        s->chunk_length = s->chunk_length*16 + (c-'a'+10);
                    } else {
                        pn->error = dupprintf(
                            "Received bad character 0x%02X in chunk length "
                            "during HTTP chunked transfer encoding",
                            (unsigned)(unsigned char)c);
                        crStopV;
                    }
                }

                /*
                 * Expect that many bytes of chunked data
                 */
                crMaybeWaitUntilV(bufchain_try_consume(
                                      pn->input, s->chunk_length));

                /* Now expect \r\n */
                {
                    char buf[2];
                    crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                          pn->input, buf, 2));
                    if (memcmp(buf, "\r\n", 2)) {
                        pn->error = dupprintf(
                            "Missing CRLF after chunk "
                            "during HTTP chunked transfer encoding");
                        crStopV;
                    }
                }
            } while (s->chunk_length);
        }

        if (200 <= s->http_status && s->http_status < 300) {
            /* Any 2xx HTTP response means we're done */
            goto authenticated;
        } else if (s->http_status == 407) {
            /* 407 is Proxy Authentication Required, which we may be
             * able to do something about. */
            if (s->connection_close) {
                /* If we got 407 + connection closed, reconnect before
                 * sending our next request. */
                pn->reconnect = true;
            }

            /* If the best we can do is report some kind of error from
             * a Proxy-Auth header (or an error saying there wasn't
             * one at all), and no successful parsing of an auth
             * header superseded that, then just throw that error and
             * die. */
            if (s->next_auth->auth_type == AUTH_ERROR) {
                pn->error = dupstr(s->next_auth->error->s);
                crStopV;
            }

            /* If we have auth details from the Conf and haven't tried
             * them yet, that's our first step. */
            if (s->try_auth_from_conf) {
                s->try_auth_from_conf = false;
                continue;
            }

            /* If the server sent us stale="true" in a Digest auth
             * header, that means we _don't_ need to request a new
             * password yet; just try again with the existing details
             * and the fresh nonce it sent us. */
            if (s->next_auth->digest_nonce_was_stale)
                continue;

            /* Either we never had a password in the first place, or
             * the one we already presented was rejected. We can only
             * proceed from here if we have a way to ask the user
             * questions. */
            if (!pn->itr) {
                pn->error = dupprintf("HTTP proxy requested authentication "
                                      "which we do not have");
                crStopV;
            }

            /*
             * Send some prompts to the user. We'll assume the
             * password is always required (since it's just been
             * rejected, even if we did send one before), and we'll
             * prompt for the username only if we don't have one from
             * the Conf.
             */
            s->prompts = proxy_new_prompts(pn->ps);
            s->prompts->to_server = true;
            s->prompts->from_server = false;
            s->prompts->name = dupstr("HTTP proxy authentication");
            if (!s->username->len) {
                s->username_prompt_index = s->prompts->n_prompts;
                add_prompt(s->prompts, dupstr("Proxy username: "), true);
            } else {
                s->username_prompt_index = -1;
            }

            s->password_prompt_index = s->prompts->n_prompts;
            add_prompt(s->prompts, dupstr("Proxy password: "), false);

            while (true) {
                SeatPromptResult spr = seat_get_userpass_input(
                    interactor_announce(pn->itr), s->prompts);
                if (spr.kind == SPRK_OK) {
                    break;
                } else if (spr_is_abort(spr)) {
                    proxy_spr_abort(pn, spr);
                    crStopV;
                }
                crReturnV;
            }

            if (s->username_prompt_index != -1) {
                strbuf_clear(s->username);
                put_dataz(s->username,
                          prompt_get_result_ref(
                              s->prompts->prompts[s->username_prompt_index]));
            }

            strbuf_clear(s->password);
            put_dataz(s->password,
                      prompt_get_result_ref(
                          s->prompts->prompts[s->password_prompt_index]));

            free_prompts(s->prompts);
            s->prompts = NULL;
        } else {
            /* Any other HTTP response is treated as permanent failure */
            pn->error = dupprintf("HTTP response %s",
                                  s->response->s + s->http_status_pos);
            crStopV;
        }
    }

  authenticated:
    /*
     * Success! Hand over to the main connection.
     */
    pn->done = true;

    crFinishV;
}